

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_compute_num_workers_for_mt(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    iVar1 = 0;
    switch(uVar4 & 0xffffffff) {
    case 0:
      iVar1 = 0;
      if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) goto switchD_001c62da_caseD_2;
      break;
    case 1:
      if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) goto switchD_001c62da_caseD_2;
      iVar3 = (cpi->oxcf).max_threads;
      iVar1 = 1;
      if (1 < iVar3) {
        iVar2 = (cpi->common).height;
        iVar1 = iVar2 + 0x1f;
        iVar2 = iVar2 + 0x3e;
        if (-1 < iVar1) {
          iVar2 = iVar1;
        }
        iVar1 = iVar2 >> 5;
        if (iVar3 < iVar2 >> 5) {
          iVar1 = iVar3;
        }
      }
      break;
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
switchD_001c62da_caseD_2:
      iVar1 = compute_num_enc_workers(cpi,(cpi->oxcf).max_threads);
      break;
    case 3:
      iVar1 = 1;
      break;
    case 9:
      iVar3 = (cpi->oxcf).max_threads;
      iVar1 = 1;
      if (1 < iVar3) {
        iVar1 = (cpi->common).tiles.rows * (cpi->common).tiles.cols;
LAB_001c635f:
        if (iVar3 <= iVar1) {
          iVar1 = iVar3;
        }
      }
      break;
    case 10:
      iVar1 = (cpi->ppi->p_mt_info).num_mod_workers[10];
      break;
    case 0xb:
      iVar1 = 0;
      if ((cpi->oxcf).pass == AOM_RC_ONE_PASS) {
        iVar3 = (cpi->oxcf).max_threads;
        iVar1 = 1;
        if ((1 < iVar3) && ((cpi->oxcf).row_mt == true)) {
          cpi->weber_bsize = BLOCK_8X8;
          iVar1 = (cpi->common).mi_params.mi_rows / 2;
          goto LAB_001c635f;
        }
      }
    }
    (cpi->ppi->p_mt_info).num_mod_workers[uVar4] = iVar1;
    uVar4 = uVar4 + 1;
    if (uVar4 == 0xc) {
      return;
    }
  } while( true );
}

Assistant:

void av1_compute_num_workers_for_mt(AV1_COMP *cpi) {
  for (int i = MOD_FP; i < NUM_MT_MODULES; i++) {
    cpi->ppi->p_mt_info.num_mod_workers[i] =
        compute_num_mod_workers(cpi, (MULTI_THREADED_MODULES)i);
  }
}